

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cpio.c
# Opt level: O1

int header_odc(archive_read *a,cpio_conflict *cpio,archive_entry *entry,size_t *namelength,
              size_t *name_pad)

{
  int iVar1;
  int *h;
  ulong uVar2;
  void *pvVar3;
  dev_t dVar4;
  int64_t iVar5;
  long lVar6;
  size_t sVar7;
  byte bVar8;
  char *fmt;
  int *h_00;
  int *piVar9;
  mode_t mVar10;
  uint nlink;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  ssize_t bytes;
  size_t local_38;
  
  (a->archive).archive_format = 0x10001;
  (a->archive).archive_format_name = "POSIX octet-oriented cpio";
  h = (int *)__archive_read_ahead(a,0x4c,(ssize_t *)&local_38);
  iVar1 = -0x1e;
  bVar13 = true;
  if (h != (int *)0x0) {
    lVar6 = 0;
    do {
      sVar7 = local_38;
      if ((short)h[1] == 0x3730 && *h == 0x37303730) {
        lVar11 = -0x4b;
        do {
          bVar8 = *(char *)((long)h + lVar11 + 0x4b) - 0x38;
          if (bVar8 < 0xf8) break;
          bVar13 = lVar11 != 0;
          lVar11 = lVar11 + 1;
        } while (bVar13);
        if (0xf7 < bVar8) {
          bVar13 = false;
          iVar1 = 0;
          goto LAB_0011ce3f;
        }
      }
      if (((short)h[1] == 0x3732 && *h == 0x37303730) &&
         (iVar1 = is_afio_large((char *)h,local_38), iVar1 != 0)) {
        (a->archive).archive_format = 0x10006;
        bVar13 = false;
        iVar1 = 0;
        goto LAB_0011ce3f;
      }
      piVar9 = h;
      if (0x4b < (long)sVar7) {
        uVar12 = sVar7 + (long)h;
        h_00 = h;
        do {
          if (*(char *)((long)h_00 + 5) == '0') {
            lVar11 = 1;
          }
          else {
            if (*(char *)((long)h_00 + 5) == '7') {
              if ((short)h_00[1] == 0x3730 && *h_00 == 0x37303730) {
                lVar11 = -0x4b;
                do {
                  bVar8 = *(char *)((long)h_00 + lVar11 + 0x4b) - 0x38;
                  if (bVar8 < 0xf8) break;
                  bVar13 = lVar11 != 0;
                  lVar11 = lVar11 + 1;
                } while (bVar13);
                if (bVar8 < 0xf8) goto LAB_0011cd29;
              }
              else {
LAB_0011cd29:
                lVar11 = 2;
                if (((short)h_00[1] != 0x3732 || *h_00 != 0x37303730) ||
                   (iVar1 = is_afio_large((char *)h_00,uVar12 - (long)h_00), iVar1 == 0))
                goto LAB_0011cd66;
              }
              __archive_read_consume(a,(long)h_00 - (long)h);
              uVar12 = ((long)h_00 - (long)h) + lVar6;
              if ((char)h_00[1] == '2') {
                (a->archive).archive_format = 0x10006;
              }
              if (uVar12 == 0) {
                bVar13 = false;
                iVar1 = 0;
              }
              else {
                archive_set_error(&a->archive,0,"Skipped %d bytes before finding valid header",
                                  uVar12 & 0xffffffff);
                bVar13 = false;
                iVar1 = -0x14;
              }
              goto LAB_0011ce3f;
            }
            lVar11 = 6;
          }
LAB_0011cd66:
          piVar9 = (int *)(lVar11 + (long)h_00);
          uVar2 = (long)h_00 + lVar11 + 0x4c;
          h_00 = piVar9;
        } while (uVar2 <= uVar12);
      }
      __archive_read_consume(a,(long)piVar9 - (long)h);
      lVar6 = lVar6 + ((long)piVar9 - (long)h);
      h = (int *)__archive_read_ahead(a,0x4c,(ssize_t *)&local_38);
    } while (h != (int *)0x0);
    iVar1 = -0x1e;
    bVar13 = true;
  }
LAB_0011ce3f:
  if (bVar13) {
    return iVar1;
  }
  if ((a->archive).archive_format == 0x10006) {
    (a->archive).archive_format = 0x10006;
    (a->archive).archive_format_name = "afio large ASCII";
    pvVar3 = __archive_read_ahead(a,0x74,(ssize_t *)0x0);
    if (pvVar3 != (void *)0x0) {
      dVar4 = atol16((char *)((long)pvVar3 + 6),8);
      archive_entry_set_dev(entry,dVar4);
      iVar5 = atol16((char *)((long)pvVar3 + 0xe),0x10);
      if (iVar5 < 0) {
        fmt = "Nonsensical ino value";
      }
      else {
        archive_entry_set_ino(entry,iVar5);
        lVar6 = 0;
        mVar10 = 0;
        do {
          bVar8 = *(byte *)((long)pvVar3 + lVar6 + 0x1f);
          if ((bVar8 & 0xf8) != 0x30) break;
          mVar10 = (uint)(byte)(bVar8 - 0x30) + mVar10 * 8;
          lVar6 = lVar6 + 1;
        } while ((int)lVar6 != 6);
        archive_entry_set_mode(entry,mVar10);
        iVar5 = atol16((char *)((long)pvVar3 + 0x25),8);
        archive_entry_set_uid(entry,iVar5);
        iVar5 = atol16((char *)((long)pvVar3 + 0x2d),8);
        archive_entry_set_gid(entry,iVar5);
        iVar5 = atol16((char *)((long)pvVar3 + 0x35),8);
        archive_entry_set_nlink(entry,(uint)iVar5);
        dVar4 = atol16((char *)((long)pvVar3 + 0x3d),8);
        archive_entry_set_rdev(entry,dVar4);
        iVar5 = atol16((char *)((long)pvVar3 + 0x45),0x10);
        archive_entry_set_mtime(entry,iVar5,0);
        sVar7 = atol16((char *)((long)pvVar3 + 0x56),4);
        *namelength = sVar7;
        *name_pad = 0;
        iVar5 = atol16((char *)((long)pvVar3 + 99),0x10);
        if (-1 < iVar5) {
          cpio->entry_bytes_remaining = iVar5;
          archive_entry_set_size(entry,iVar5);
          cpio->entry_padding = 0;
          iVar5 = 0x74;
          goto LAB_0011d1d7;
        }
        fmt = "Nonsensical file size";
      }
      archive_set_error(&a->archive,0,fmt);
    }
  }
  else {
    pvVar3 = __archive_read_ahead(a,0x4c,(ssize_t *)0x0);
    if (pvVar3 != (void *)0x0) {
      lVar6 = 0;
      dVar4 = 0;
      do {
        bVar8 = *(byte *)((long)pvVar3 + lVar6 + 6);
        if ((bVar8 & 0xf8) != 0x30) break;
        dVar4 = (ulong)(byte)(bVar8 - 0x30) + dVar4 * 8;
        lVar6 = lVar6 + 1;
      } while ((int)lVar6 != 6);
      archive_entry_set_dev(entry,dVar4);
      lVar11 = 0;
      lVar6 = 0;
      do {
        bVar8 = *(byte *)((long)pvVar3 + lVar11 + 0xc);
        if ((bVar8 & 0xf8) != 0x30) break;
        lVar6 = (ulong)(byte)(bVar8 - 0x30) + lVar6 * 8;
        lVar11 = lVar11 + 1;
      } while ((int)lVar11 != 6);
      archive_entry_set_ino(entry,lVar6);
      lVar6 = 0;
      mVar10 = 0;
      do {
        bVar8 = *(byte *)((long)pvVar3 + lVar6 + 0x12);
        if ((bVar8 & 0xf8) != 0x30) break;
        mVar10 = (uint)(byte)(bVar8 - 0x30) + mVar10 * 8;
        lVar6 = lVar6 + 1;
      } while ((int)lVar6 != 6);
      archive_entry_set_mode(entry,mVar10);
      lVar11 = 0;
      lVar6 = 0;
      do {
        bVar8 = *(byte *)((long)pvVar3 + lVar11 + 0x18);
        if ((bVar8 & 0xf8) != 0x30) break;
        lVar6 = (ulong)(byte)(bVar8 - 0x30) + lVar6 * 8;
        lVar11 = lVar11 + 1;
      } while ((int)lVar11 != 6);
      archive_entry_set_uid(entry,lVar6);
      lVar11 = 0;
      lVar6 = 0;
      do {
        bVar8 = *(byte *)((long)pvVar3 + lVar11 + 0x1e);
        if ((bVar8 & 0xf8) != 0x30) break;
        lVar6 = (ulong)(byte)(bVar8 - 0x30) + lVar6 * 8;
        lVar11 = lVar11 + 1;
      } while ((int)lVar11 != 6);
      archive_entry_set_gid(entry,lVar6);
      lVar6 = 0;
      nlink = 0;
      do {
        bVar8 = *(byte *)((long)pvVar3 + lVar6 + 0x24);
        if ((bVar8 & 0xf8) != 0x30) break;
        nlink = (uint)(byte)(bVar8 - 0x30) + nlink * 8;
        lVar6 = lVar6 + 1;
      } while ((int)lVar6 != 6);
      archive_entry_set_nlink(entry,nlink);
      lVar6 = 0;
      dVar4 = 0;
      do {
        bVar8 = *(byte *)((long)pvVar3 + lVar6 + 0x2a);
        if ((bVar8 & 0xf8) != 0x30) break;
        dVar4 = (ulong)(byte)(bVar8 - 0x30) + dVar4 * 8;
        lVar6 = lVar6 + 1;
      } while ((int)lVar6 != 6);
      archive_entry_set_rdev(entry,dVar4);
      lVar11 = 0;
      lVar6 = 0;
      do {
        bVar8 = *(byte *)((long)pvVar3 + lVar11 + 0x30);
        if ((bVar8 & 0xf8) != 0x30) break;
        lVar6 = (ulong)(byte)(bVar8 - 0x30) + lVar6 * 8;
        lVar11 = lVar11 + 1;
      } while ((int)lVar11 != 0xb);
      lVar11 = 0;
      archive_entry_set_mtime(entry,lVar6,0);
      sVar7 = 0;
      do {
        bVar8 = *(byte *)((long)pvVar3 + lVar11 + 0x3b);
        if ((bVar8 & 0xf8) != 0x30) break;
        sVar7 = (ulong)(byte)(bVar8 - 0x30) + sVar7 * 8;
        lVar11 = lVar11 + 1;
      } while ((int)lVar11 != 6);
      *namelength = sVar7;
      *name_pad = 0;
      lVar11 = 0;
      lVar6 = 0;
      do {
        bVar8 = *(byte *)((long)pvVar3 + lVar11 + 0x41);
        if ((bVar8 & 0xf8) != 0x30) break;
        lVar6 = (ulong)(byte)(bVar8 - 0x30) + lVar6 * 8;
        lVar11 = lVar11 + 1;
      } while ((int)lVar11 != 0xb);
      cpio->entry_bytes_remaining = lVar6;
      archive_entry_set_size(entry,lVar6);
      cpio->entry_padding = 0;
      iVar5 = 0x4c;
LAB_0011d1d7:
      __archive_read_consume(a,iVar5);
      return iVar1;
    }
  }
  return -0x1e;
}

Assistant:

static int
header_odc(struct archive_read *a, struct cpio *cpio,
    struct archive_entry *entry, size_t *namelength, size_t *name_pad)
{
	const void *h;
	int r;
	const char *header;

	a->archive.archive_format = ARCHIVE_FORMAT_CPIO_POSIX;
	a->archive.archive_format_name = "POSIX octet-oriented cpio";

	/* Find the start of the next header. */
	r = find_odc_header(a);
	if (r < ARCHIVE_WARN)
		return (r);

	if (a->archive.archive_format == ARCHIVE_FORMAT_CPIO_AFIO_LARGE) {
		int r2 = (header_afiol(a, cpio, entry, namelength, name_pad));
		if (r2 == ARCHIVE_OK)
			return (r);
		else
			return (r2);
	}

	/* Read fixed-size portion of header. */
	h = __archive_read_ahead(a, odc_header_size, NULL);
	if (h == NULL)
	    return (ARCHIVE_FATAL);

	/* Parse out octal fields. */
	header = (const char *)h;

	archive_entry_set_dev(entry, 
		(dev_t)atol8(header + odc_dev_offset, odc_dev_size));
	archive_entry_set_ino(entry, atol8(header + odc_ino_offset, odc_ino_size));
	archive_entry_set_mode(entry, 
		(mode_t)atol8(header + odc_mode_offset, odc_mode_size));
	archive_entry_set_uid(entry, atol8(header + odc_uid_offset, odc_uid_size));
	archive_entry_set_gid(entry, atol8(header + odc_gid_offset, odc_gid_size));
	archive_entry_set_nlink(entry, 
		(unsigned int)atol8(header + odc_nlink_offset, odc_nlink_size));
	archive_entry_set_rdev(entry,
		(dev_t)atol8(header + odc_rdev_offset, odc_rdev_size));
	archive_entry_set_mtime(entry, atol8(header + odc_mtime_offset, odc_mtime_size), 0);
	*namelength = (size_t)atol8(header + odc_namesize_offset, odc_namesize_size);
	*name_pad = 0; /* No padding of filename. */

	/*
	 * Note: entry_bytes_remaining is at least 64 bits and
	 * therefore guaranteed to be big enough for a 33-bit file
	 * size.
	 */
	cpio->entry_bytes_remaining =
	    atol8(header + odc_filesize_offset, odc_filesize_size);
	archive_entry_set_size(entry, cpio->entry_bytes_remaining);
	cpio->entry_padding = 0;
	__archive_read_consume(a, odc_header_size);
	return (r);
}